

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O1

void __thiscall
higan::TcpServer::TcpServer(TcpServer *this,EventLoop *loop,InetAddress *addr,string *server_name)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  undefined1 auStack_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  this->loop_ = loop;
  auStack_58 = (undefined1  [8])&__str._M_string_length;
  pcVar2 = (server_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_58,pcVar2,pcVar2 + server_name->_M_string_length);
  std::__cxx11::string::append((char *)auStack_58);
  EventLoopThreadPool::EventLoopThreadPool(&this->thread_pool_,(string *)auStack_58,loop);
  if (auStack_58 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)auStack_58,__str._M_string_length + 1);
  }
  (this->server_name_)._M_dataplus._M_p = (pointer)&(this->server_name_).field_2;
  pcVar2 = (server_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->server_name_,pcVar2,pcVar2 + server_name->_M_string_length);
  (this->server_addr_).ip_._M_dataplus._M_p = (pointer)&(this->server_addr_).ip_.field_2;
  pcVar2 = (addr->ip_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->server_addr_,pcVar2,pcVar2 + (addr->ip_)._M_string_length);
  (this->server_addr_).port_ = addr->port_;
  Acceptor::Acceptor(&this->acceptor_,this->loop_,addr);
  p_Var1 = &(this->connection_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->connection_map_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  *(undefined8 *)((long)&(this->message_callback_).super__Function_base._M_functor + 8) = 0;
  (this->message_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->message_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->newconnection_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->newconnection_callback_).super__Function_base._M_functor + 8) = 0;
  (this->newconnection_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->connection_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->message_callback_).super__Function_base._M_functor = 0;
  (this->newconnection_callback_)._M_invoker = (_Invoker_type)0x0;
  __str._M_string_length = 0;
  __str.field_2._M_allocated_capacity = 0;
  auStack_58 = (undefined1  [8])0x0;
  __str._M_dataplus._M_p = (pointer)0x0;
  auStack_58 = (undefined1  [8])operator_new(0x18);
  *(code **)auStack_58 = OnNewConnection;
  *(char *)((long)auStack_58 + 8) = '\0';
  *(char *)((long)auStack_58 + 9) = '\0';
  *(char *)((long)auStack_58 + 10) = '\0';
  *(char *)((long)auStack_58 + 0xb) = '\0';
  *(char *)((long)auStack_58 + 0xc) = '\0';
  *(char *)((long)auStack_58 + 0xd) = '\0';
  *(char *)((long)auStack_58 + 0xe) = '\0';
  *(char *)((long)auStack_58 + 0xf) = '\0';
  *(TcpServer **)((long)auStack_58 + 0x10) = this;
  __str.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(int,_const_higan::InetAddress_&),_std::_Bind<void_(higan::TcpServer::*(higan::TcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_const_higan::InetAddress_&)>_>
       ::_M_invoke;
  __str._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(int,_const_higan::InetAddress_&),_std::_Bind<void_(higan::TcpServer::*(higan::TcpServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_const_higan::InetAddress_&)>_>
       ::_M_manager;
  Acceptor::SetNewConnectionCallback(&this->acceptor_,(NewConnectionCallback *)auStack_58);
  if (__str._M_string_length != 0) {
    (*(code *)__str._M_string_length)(auStack_58,auStack_58,3);
  }
  return;
}

Assistant:

TcpServer::TcpServer(EventLoop* loop, const InetAddress& addr, const std::string& server_name):
		loop_(loop),
		thread_pool_(server_name + "Pool", loop),
		server_name_(server_name),
		server_addr_(addr),
		acceptor_(loop_, addr),
		connection_map_()
{
	acceptor_.SetNewConnectionCallback(std::bind(&TcpServer::OnNewConnection,
			this, _1, _2));
}